

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::MaxPlus_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  double dVar3;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  if (key - 1U < 5) {
    pvVar1 = state->input;
    switch(key) {
    case 1:
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x1e0) = (long)iVar2;
      break;
    case 2:
      std::__cxx11::string::string<std::allocator<char>>((string *)local_30,arg,&local_31);
      std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x1e8),(string *)local_30);
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
      }
      break;
    case 3:
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x1c8) = (long)iVar2;
      break;
    case 4:
      iVar2 = atoi(arg);
      *(long *)((long)pvVar1 + 0x1d0) = (long)iVar2;
      break;
    case 5:
      dVar3 = atof(arg);
      *(double *)((long)pvVar1 + 0x1d8) = dVar3;
    }
    return 0;
  }
  return 7;
}

Assistant:

error_t
MaxPlus_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case MAXPLUS_RESTARTS:
        theArgumentsStruc->maxplus_nrRestarts =  atoi(arg);
        break;
    case MAXPLUS_UPDATE:
        theArgumentsStruc->maxplus_updateT =  std::string(arg);
        break;
    case MAXPLUS_ITER:
        theArgumentsStruc->maxplus_maxiter =  atoi(arg);
        break;
    case MAXPLUS_VERB:
        theArgumentsStruc->maxplus_verbose =  atoi(arg);
        break;
    case MAXPLUS_DAMP:
        theArgumentsStruc->maxplus_damping =  atof(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}